

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_core_validation.cpp
# Opt level: O0

XrResult ValidateXrStruct(GenValidUsageXrInstanceInfo *instance_info,string *command_name,
                         vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                         *objects_info,bool check_members,bool check_pnext,XrWorldMeshBlockML *value
                         )

{
  pointer *this;
  pointer *this_00;
  bool bVar1;
  allocator local_be9;
  string local_be8 [32];
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_bc8;
  allocator local_ba9;
  string local_ba8 [39];
  allocator local_b81;
  string local_b80 [32];
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_b60;
  allocator local_b41;
  string local_b40 [39];
  allocator local_b19;
  string local_b18 [32];
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_af8;
  allocator local_ad9;
  string local_ad8 [39];
  allocator local_ab1;
  string local_ab0 [32];
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_a90;
  allocator local_a71;
  string local_a70 [39];
  allocator local_a49;
  string local_a48 [32];
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_a28;
  allocator local_a09;
  string local_a08 [39];
  allocator local_9e1;
  string local_9e0 [32];
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_9c0;
  allocator local_9a1;
  string local_9a0 [39];
  allocator local_979;
  string local_978 [32];
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_958;
  allocator local_939;
  string local_938 [39];
  allocator local_911;
  string local_910 [32];
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_8f0;
  allocator local_8d1;
  string local_8d0 [32];
  string local_8b0 [32];
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_890;
  allocator local_871;
  string local_870 [32];
  string local_850 [32];
  ostringstream local_830 [8];
  ostringstream oss_enum_2;
  allocator local_6b1;
  string local_6b0 [32];
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_690;
  allocator local_671;
  string local_670 [36];
  ValidateXrFlagsResult local_64c;
  string local_648 [4];
  ValidateXrFlagsResult world_mesh_detector_flags_ml_result;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_628;
  allocator local_609;
  string local_608 [32];
  string local_5e8 [32];
  ostringstream local_5c8 [8];
  ostringstream oss_enum_1;
  allocator local_449;
  string local_448 [39];
  allocator local_421;
  string local_420 [32];
  string local_400 [32];
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_3e0;
  allocator local_3c1;
  string local_3c0 [32];
  string local_3a0 [32];
  ostringstream local_380 [8];
  ostringstream oss_enum;
  allocator local_201;
  string local_200 [39];
  allocator local_1d9;
  string local_1d8 [39];
  allocator local_1b1;
  string local_1b0 [32];
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_190;
  allocator local_171;
  string local_170 [32];
  undefined1 local_150 [40];
  string local_128 [8];
  string error_message;
  allocator local_101;
  string local_100 [32];
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_e0;
  allocator local_c1;
  string local_c0 [52];
  NextChainResult local_8c;
  undefined1 local_88 [4];
  NextChainResult next_result;
  vector<XrStructureType,_std::allocator<XrStructureType>_> encountered_structs;
  vector<XrStructureType,_std::allocator<XrStructureType>_> duplicate_ext_structs;
  vector<XrStructureType,_std::allocator<XrStructureType>_> valid_ext_structs;
  XrResult xr_result;
  XrWorldMeshBlockML *value_local;
  bool check_pnext_local;
  bool check_members_local;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *objects_info_local;
  string *command_name_local;
  GenValidUsageXrInstanceInfo *instance_info_local;
  
  valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = XR_SUCCESS;
  if (value->type != XR_TYPE_WORLD_MESH_BLOCK_ML) {
    InvalidStructureType
              (instance_info,command_name,objects_info,"XrWorldMeshBlockML",value->type,
               "VUID-XrWorldMeshBlockML-type-type",XR_TYPE_WORLD_MESH_BLOCK_ML,
               "XR_TYPE_WORLD_MESH_BLOCK_ML");
    valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = XR_ERROR_VALIDATION_FAILURE;
  }
  if (check_pnext) {
    this = &duplicate_ext_structs.
            super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage;
    std::vector<XrStructureType,_std::allocator<XrStructureType>_>::vector
              ((vector<XrStructureType,_std::allocator<XrStructureType>_> *)this);
    this_00 = &encountered_structs.
               super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    std::vector<XrStructureType,_std::allocator<XrStructureType>_>::vector
              ((vector<XrStructureType,_std::allocator<XrStructureType>_> *)this_00);
    std::vector<XrStructureType,_std::allocator<XrStructureType>_>::vector
              ((vector<XrStructureType,_std::allocator<XrStructureType>_> *)local_88);
    local_8c = ValidateNextChain(instance_info,command_name,objects_info,value->next,
                                 (vector<XrStructureType,_std::allocator<XrStructureType>_> *)this,
                                 (vector<XrStructureType,_std::allocator<XrStructureType>_> *)
                                 local_88,(vector<XrStructureType,_std::allocator<XrStructureType>_>
                                           *)this_00);
    if (local_8c == NEXT_CHAIN_RESULT_ERROR) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_c0,"VUID-XrWorldMeshBlockML-next-next",&local_c1);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                (&local_e0,objects_info);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_100,
                 "Invalid structure(s) in \"next\" chain for XrWorldMeshBlockML struct \"next\"",
                 &local_101);
      CoreValidLogMessage(instance_info,(string *)local_c0,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                          command_name,&local_e0,(string *)local_100);
      std::__cxx11::string::~string(local_100);
      std::allocator<char>::~allocator((allocator<char> *)&local_101);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::~vector
                (&local_e0);
      std::__cxx11::string::~string(local_c0);
      std::allocator<char>::~allocator((allocator<char> *)&local_c1);
      valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = XR_ERROR_VALIDATION_FAILURE;
    }
    else if (local_8c == NEXT_CHAIN_RESULT_DUPLICATE_STRUCT) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_128,"Multiple structures of the same type(s) in \"next\" chain for ",
                 (allocator *)(local_150 + 0x27));
      std::allocator<char>::~allocator((allocator<char> *)(local_150 + 0x27));
      std::__cxx11::string::operator+=(local_128,"XrWorldMeshBlockML : ");
      StructTypesToString_abi_cxx11_
                ((GenValidUsageXrInstanceInfo *)local_150,
                 (vector<XrStructureType,_std::allocator<XrStructureType>_> *)instance_info);
      std::__cxx11::string::operator+=(local_128,(string *)local_150);
      std::__cxx11::string::~string((string *)local_150);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_170,"VUID-XrWorldMeshBlockML-next-unique",&local_171);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                (&local_190,objects_info);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_1b0,
                 "Multiple structures of the same type(s) in \"next\" chain for XrWorldMeshBlockML struct"
                 ,&local_1b1);
      CoreValidLogMessage(instance_info,(string *)local_170,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                          command_name,&local_190,(string *)local_1b0);
      std::__cxx11::string::~string(local_1b0);
      std::allocator<char>::~allocator((allocator<char> *)&local_1b1);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::~vector
                (&local_190);
      std::__cxx11::string::~string(local_170);
      std::allocator<char>::~allocator((allocator<char> *)&local_171);
      valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = XR_ERROR_VALIDATION_FAILURE;
      std::__cxx11::string::~string(local_128);
    }
    std::vector<XrStructureType,_std::allocator<XrStructureType>_>::~vector
              ((vector<XrStructureType,_std::allocator<XrStructureType>_> *)local_88);
    std::vector<XrStructureType,_std::allocator<XrStructureType>_>::~vector
              ((vector<XrStructureType,_std::allocator<XrStructureType>_> *)
               &encountered_structs.
                super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    std::vector<XrStructureType,_std::allocator<XrStructureType>_>::~vector
              ((vector<XrStructureType,_std::allocator<XrStructureType>_> *)
               &duplicate_ext_structs.
                super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
  }
  if ((check_members) &&
     (valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ == XR_SUCCESS)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1d8,"XrWorldMeshBlockML",&local_1d9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_200,"blockResult",&local_201);
    bVar1 = ValidateXrEnum(instance_info,command_name,(string *)local_1d8,(string *)local_200,
                           objects_info,value->blockResult);
    std::__cxx11::string::~string(local_200);
    std::allocator<char>::~allocator((allocator<char> *)&local_201);
    std::__cxx11::string::~string(local_1d8);
    std::allocator<char>::~allocator((allocator<char> *)&local_1d9);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_420,"XrWorldMeshBlockML",&local_421);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_448,"lod",&local_449);
      bVar1 = ValidateXrEnum(instance_info,command_name,(string *)local_420,(string *)local_448,
                             objects_info,value->lod);
      std::__cxx11::string::~string(local_448);
      std::allocator<char>::~allocator((allocator<char> *)&local_449);
      std::__cxx11::string::~string(local_420);
      std::allocator<char>::~allocator((allocator<char> *)&local_421);
      if (((bVar1 ^ 0xffU) & 1) == 0) {
        local_64c = ValidateXrWorldMeshDetectorFlagsML(value->flags);
        if (local_64c == VALIDATE_XR_FLAGS_ZERO) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    (local_670,"VUID-XrWorldMeshBlockML-flags-requiredbitmask",&local_671);
          std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                    (&local_690,objects_info);
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    (local_6b0,"XrWorldMeshDetectorFlagsML \"flags\" flag must be non-zero",
                     &local_6b1);
          CoreValidLogMessage(instance_info,(string *)local_670,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                              command_name,&local_690,(string *)local_6b0);
          std::__cxx11::string::~string(local_6b0);
          std::allocator<char>::~allocator((allocator<char> *)&local_6b1);
          std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
          ~vector(&local_690);
          std::__cxx11::string::~string(local_670);
          std::allocator<char>::~allocator((allocator<char> *)&local_671);
          instance_info_local._4_4_ = XR_ERROR_VALIDATION_FAILURE;
        }
        else if (local_64c == VALIDATE_XR_FLAGS_SUCCESS) {
          if ((value->indexCount == 0) && (value->indexBuffer != (uint16_t *)0x0)) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      (local_8d0,"VUID-XrWorldMeshBlockML-indexCount-arraylength",&local_8d1);
            std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
            vector(&local_8f0,objects_info);
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      (local_910,
                       "Structure XrWorldMeshBlockML member indexCount is non-optional and must be greater than 0"
                       ,&local_911);
            CoreValidLogMessage(instance_info,(string *)local_8d0,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                                command_name,&local_8f0,(string *)local_910);
            std::__cxx11::string::~string(local_910);
            std::allocator<char>::~allocator((allocator<char> *)&local_911);
            std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
            ~vector(&local_8f0);
            std::__cxx11::string::~string(local_8d0);
            std::allocator<char>::~allocator((allocator<char> *)&local_8d1);
            valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = XR_ERROR_VALIDATION_FAILURE;
          }
          if ((value->indexBuffer == (uint16_t *)0x0) && (value->indexCount != 0)) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      (local_938,"VUID-XrWorldMeshBlockML-indexBuffer-parameter",&local_939);
            std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
            vector(&local_958,objects_info);
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      (local_978,
                       "XrWorldMeshBlockML contains invalid NULL for uint16_t \"indexBuffer\" is which not optional since \"indexCount\" is set and must be non-NULL"
                       ,&local_979);
            CoreValidLogMessage(instance_info,(string *)local_938,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                                command_name,&local_958,(string *)local_978);
            std::__cxx11::string::~string(local_978);
            std::allocator<char>::~allocator((allocator<char> *)&local_979);
            std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
            ~vector(&local_958);
            std::__cxx11::string::~string(local_938);
            std::allocator<char>::~allocator((allocator<char> *)&local_939);
            instance_info_local._4_4_ = XR_ERROR_VALIDATION_FAILURE;
          }
          else {
            if ((value->vertexCount == 0) && (value->vertexBuffer != (XrVector3f *)0x0)) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string
                        (local_9a0,"VUID-XrWorldMeshBlockML-vertexCount-arraylength",&local_9a1);
              std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
              vector(&local_9c0,objects_info);
              std::allocator<char>::allocator();
              std::__cxx11::string::string
                        (local_9e0,
                         "Structure XrWorldMeshBlockML member vertexCount is non-optional and must be greater than 0"
                         ,&local_9e1);
              CoreValidLogMessage(instance_info,(string *)local_9a0,VALID_USAGE_DEBUG_SEVERITY_ERROR
                                  ,command_name,&local_9c0,(string *)local_9e0);
              std::__cxx11::string::~string(local_9e0);
              std::allocator<char>::~allocator((allocator<char> *)&local_9e1);
              std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
              ~vector(&local_9c0);
              std::__cxx11::string::~string(local_9a0);
              std::allocator<char>::~allocator((allocator<char> *)&local_9a1);
              valid_ext_structs.
              super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage._4_4_ = XR_ERROR_VALIDATION_FAILURE;
            }
            if ((value->vertexBuffer == (XrVector3f *)0x0) && (value->vertexCount != 0)) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string
                        (local_a08,"VUID-XrWorldMeshBlockML-vertexBuffer-parameter",&local_a09);
              std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
              vector(&local_a28,objects_info);
              std::allocator<char>::allocator();
              std::__cxx11::string::string
                        (local_a48,
                         "XrWorldMeshBlockML contains invalid NULL for XrVector3f \"vertexBuffer\" is which not optional since \"vertexCount\" is set and must be non-NULL"
                         ,&local_a49);
              CoreValidLogMessage(instance_info,(string *)local_a08,VALID_USAGE_DEBUG_SEVERITY_ERROR
                                  ,command_name,&local_a28,(string *)local_a48);
              std::__cxx11::string::~string(local_a48);
              std::allocator<char>::~allocator((allocator<char> *)&local_a49);
              std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
              ~vector(&local_a28);
              std::__cxx11::string::~string(local_a08);
              std::allocator<char>::~allocator((allocator<char> *)&local_a09);
              instance_info_local._4_4_ = XR_ERROR_VALIDATION_FAILURE;
            }
            else {
              if ((value->normalCount == 0) && (value->normalBuffer != (XrVector3f *)0x0)) {
                std::allocator<char>::allocator();
                std::__cxx11::string::string
                          (local_a70,"VUID-XrWorldMeshBlockML-normalCount-arraylength",&local_a71);
                std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
                vector(&local_a90,objects_info);
                std::allocator<char>::allocator();
                std::__cxx11::string::string
                          (local_ab0,
                           "Structure XrWorldMeshBlockML member normalCount is non-optional and must be greater than 0"
                           ,&local_ab1);
                CoreValidLogMessage(instance_info,(string *)local_a70,
                                    VALID_USAGE_DEBUG_SEVERITY_ERROR,command_name,&local_a90,
                                    (string *)local_ab0);
                std::__cxx11::string::~string(local_ab0);
                std::allocator<char>::~allocator((allocator<char> *)&local_ab1);
                std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
                ~vector(&local_a90);
                std::__cxx11::string::~string(local_a70);
                std::allocator<char>::~allocator((allocator<char> *)&local_a71);
                valid_ext_structs.
                super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage._4_4_ = XR_ERROR_VALIDATION_FAILURE;
              }
              if ((value->normalBuffer == (XrVector3f *)0x0) && (value->normalCount != 0)) {
                std::allocator<char>::allocator();
                std::__cxx11::string::string
                          (local_ad8,"VUID-XrWorldMeshBlockML-normalBuffer-parameter",&local_ad9);
                std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
                vector(&local_af8,objects_info);
                std::allocator<char>::allocator();
                std::__cxx11::string::string
                          (local_b18,
                           "XrWorldMeshBlockML contains invalid NULL for XrVector3f \"normalBuffer\" is which not optional since \"normalCount\" is set and must be non-NULL"
                           ,&local_b19);
                CoreValidLogMessage(instance_info,(string *)local_ad8,
                                    VALID_USAGE_DEBUG_SEVERITY_ERROR,command_name,&local_af8,
                                    (string *)local_b18);
                std::__cxx11::string::~string(local_b18);
                std::allocator<char>::~allocator((allocator<char> *)&local_b19);
                std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
                ~vector(&local_af8);
                std::__cxx11::string::~string(local_ad8);
                std::allocator<char>::~allocator((allocator<char> *)&local_ad9);
                instance_info_local._4_4_ = XR_ERROR_VALIDATION_FAILURE;
              }
              else {
                if ((value->confidenceCount == 0) && (value->confidenceBuffer != (float *)0x0)) {
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string
                            (local_b40,"VUID-XrWorldMeshBlockML-confidenceCount-arraylength",
                             &local_b41);
                  std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                  ::vector(&local_b60,objects_info);
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string
                            (local_b80,
                             "Structure XrWorldMeshBlockML member confidenceCount is non-optional and must be greater than 0"
                             ,&local_b81);
                  CoreValidLogMessage(instance_info,(string *)local_b40,
                                      VALID_USAGE_DEBUG_SEVERITY_ERROR,command_name,&local_b60,
                                      (string *)local_b80);
                  std::__cxx11::string::~string(local_b80);
                  std::allocator<char>::~allocator((allocator<char> *)&local_b81);
                  std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                  ::~vector(&local_b60);
                  std::__cxx11::string::~string(local_b40);
                  std::allocator<char>::~allocator((allocator<char> *)&local_b41);
                  valid_ext_structs.
                  super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage._4_4_ = XR_ERROR_VALIDATION_FAILURE;
                }
                if ((value->confidenceBuffer == (float *)0x0) && (value->confidenceCount != 0)) {
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string
                            (local_ba8,"VUID-XrWorldMeshBlockML-confidenceBuffer-parameter",
                             &local_ba9);
                  std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                  ::vector(&local_bc8,objects_info);
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string
                            (local_be8,
                             "XrWorldMeshBlockML contains invalid NULL for float \"confidenceBuffer\" is which not optional since \"confidenceCount\" is set and must be non-NULL"
                             ,&local_be9);
                  CoreValidLogMessage(instance_info,(string *)local_ba8,
                                      VALID_USAGE_DEBUG_SEVERITY_ERROR,command_name,&local_bc8,
                                      (string *)local_be8);
                  std::__cxx11::string::~string(local_be8);
                  std::allocator<char>::~allocator((allocator<char> *)&local_be9);
                  std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                  ::~vector(&local_bc8);
                  std::__cxx11::string::~string(local_ba8);
                  std::allocator<char>::~allocator((allocator<char> *)&local_ba9);
                  instance_info_local._4_4_ = XR_ERROR_VALIDATION_FAILURE;
                }
                else {
                  instance_info_local._4_4_ =
                       valid_ext_structs.
                       super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl
                       .super__Vector_impl_data._M_end_of_storage._4_4_;
                }
              }
            }
          }
        }
        else {
          std::__cxx11::ostringstream::ostringstream(local_830);
          std::operator<<((ostream *)local_830,
                          "XrWorldMeshBlockML invalid member XrWorldMeshDetectorFlagsML \"flags\" flag value "
                         );
          Uint32ToHexString_abi_cxx11_((uint32_t)local_850);
          std::operator<<((ostream *)local_830,local_850);
          std::__cxx11::string::~string(local_850);
          std::operator<<((ostream *)local_830," contains illegal bit");
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    (local_870,"VUID-XrWorldMeshBlockML-flags-parameter",&local_871);
          std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                    (&local_890,objects_info);
          std::__cxx11::ostringstream::str();
          CoreValidLogMessage(instance_info,(string *)local_870,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                              command_name,&local_890,local_8b0);
          std::__cxx11::string::~string((string *)local_8b0);
          std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
          ~vector(&local_890);
          std::__cxx11::string::~string(local_870);
          std::allocator<char>::~allocator((allocator<char> *)&local_871);
          instance_info_local._4_4_ = XR_ERROR_VALIDATION_FAILURE;
          std::__cxx11::ostringstream::~ostringstream(local_830);
        }
      }
      else {
        std::__cxx11::ostringstream::ostringstream(local_5c8);
        std::operator<<((ostream *)local_5c8,
                        "XrWorldMeshBlockML contains invalid XrWorldMeshDetectorLodML \"lod\" enum value "
                       );
        Uint32ToHexString_abi_cxx11_((uint32_t)local_5e8);
        std::operator<<((ostream *)local_5c8,local_5e8);
        std::__cxx11::string::~string(local_5e8);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_608,"VUID-XrWorldMeshBlockML-lod-parameter",&local_609);
        std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                  (&local_628,objects_info);
        std::__cxx11::ostringstream::str();
        CoreValidLogMessage(instance_info,(string *)local_608,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                            command_name,&local_628,local_648);
        std::__cxx11::string::~string((string *)local_648);
        std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::~vector
                  (&local_628);
        std::__cxx11::string::~string(local_608);
        std::allocator<char>::~allocator((allocator<char> *)&local_609);
        instance_info_local._4_4_ = XR_ERROR_VALIDATION_FAILURE;
        std::__cxx11::ostringstream::~ostringstream(local_5c8);
      }
    }
    else {
      std::__cxx11::ostringstream::ostringstream(local_380);
      std::operator<<((ostream *)local_380,
                      "XrWorldMeshBlockML contains invalid XrWorldMeshBlockResultML \"blockResult\" enum value "
                     );
      Uint32ToHexString_abi_cxx11_((uint32_t)local_3a0);
      std::operator<<((ostream *)local_380,local_3a0);
      std::__cxx11::string::~string(local_3a0);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_3c0,"VUID-XrWorldMeshBlockML-blockResult-parameter",&local_3c1);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                (&local_3e0,objects_info);
      std::__cxx11::ostringstream::str();
      CoreValidLogMessage(instance_info,(string *)local_3c0,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                          command_name,&local_3e0,local_400);
      std::__cxx11::string::~string((string *)local_400);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::~vector
                (&local_3e0);
      std::__cxx11::string::~string(local_3c0);
      std::allocator<char>::~allocator((allocator<char> *)&local_3c1);
      instance_info_local._4_4_ = XR_ERROR_VALIDATION_FAILURE;
      std::__cxx11::ostringstream::~ostringstream(local_380);
    }
  }
  else {
    instance_info_local._4_4_ =
         valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
  }
  return instance_info_local._4_4_;
}

Assistant:

XrResult ValidateXrStruct(GenValidUsageXrInstanceInfo *instance_info, const std::string &command_name,
                          std::vector<GenValidUsageXrObjectInfo>& objects_info, bool check_members, bool check_pnext,
                          const XrWorldMeshBlockML* value) {
    XrResult xr_result = XR_SUCCESS;
    (void)xr_result;
    (void)instance_info;
    (void)command_name;
    (void)objects_info;
    (void)check_members;
    (void)value;
    // Make sure the structure type is correct
    if (value->type != XR_TYPE_WORLD_MESH_BLOCK_ML) {
        InvalidStructureType(instance_info, command_name, objects_info, "XrWorldMeshBlockML",
                             value->type, "VUID-XrWorldMeshBlockML-type-type", XR_TYPE_WORLD_MESH_BLOCK_ML, "XR_TYPE_WORLD_MESH_BLOCK_ML");
        xr_result = XR_ERROR_VALIDATION_FAILURE;
    }
    if (check_pnext) {
        std::vector<XrStructureType> valid_ext_structs;
        std::vector<XrStructureType> duplicate_ext_structs;
        std::vector<XrStructureType> encountered_structs;
        NextChainResult next_result = ValidateNextChain(instance_info, command_name, objects_info,
                                                         value->next, valid_ext_structs,
                                                         encountered_structs,
                                                         duplicate_ext_structs);
        // No valid extension structs for this 'next'.  Therefore, must be NULL
        // or only contain a list of valid extension structures.
        if (NEXT_CHAIN_RESULT_ERROR == next_result) {
            CoreValidLogMessage(instance_info, "VUID-XrWorldMeshBlockML-next-next",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                objects_info, "Invalid structure(s) in \"next\" chain for XrWorldMeshBlockML struct \"next\"");
            xr_result = XR_ERROR_VALIDATION_FAILURE;
        } else if (NEXT_CHAIN_RESULT_DUPLICATE_STRUCT == next_result) {
            std::string error_message = "Multiple structures of the same type(s) in \"next\" chain for ";
            error_message += "XrWorldMeshBlockML : ";
            error_message += StructTypesToString(instance_info, duplicate_ext_structs);
            CoreValidLogMessage(instance_info, "VUID-XrWorldMeshBlockML-next-unique",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                objects_info,
            "Multiple structures of the same type(s) in \"next\" chain for XrWorldMeshBlockML struct");
            xr_result = XR_ERROR_VALIDATION_FAILURE;
        }
    }
    // If we are not to check the rest of the members, just return here.
    if (!check_members || XR_SUCCESS != xr_result) {
        return xr_result;
    }
    // Make sure the enum type XrWorldMeshBlockResultML value is valid
    if (!ValidateXrEnum(instance_info, command_name, "XrWorldMeshBlockML", "blockResult", objects_info, value->blockResult)) {
        std::ostringstream oss_enum;
        oss_enum << "XrWorldMeshBlockML contains invalid XrWorldMeshBlockResultML \"blockResult\" enum value ";
        oss_enum << Uint32ToHexString(static_cast<uint32_t>(value->blockResult));
        CoreValidLogMessage(instance_info, "VUID-XrWorldMeshBlockML-blockResult-parameter",
                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                            objects_info, oss_enum.str());
        return XR_ERROR_VALIDATION_FAILURE;
    }
    // Make sure the enum type XrWorldMeshDetectorLodML value is valid
    if (!ValidateXrEnum(instance_info, command_name, "XrWorldMeshBlockML", "lod", objects_info, value->lod)) {
        std::ostringstream oss_enum;
        oss_enum << "XrWorldMeshBlockML contains invalid XrWorldMeshDetectorLodML \"lod\" enum value ";
        oss_enum << Uint32ToHexString(static_cast<uint32_t>(value->lod));
        CoreValidLogMessage(instance_info, "VUID-XrWorldMeshBlockML-lod-parameter",
                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                            objects_info, oss_enum.str());
        return XR_ERROR_VALIDATION_FAILURE;
    }
    ValidateXrFlagsResult world_mesh_detector_flags_ml_result = ValidateXrWorldMeshDetectorFlagsML(value->flags);
    // Flags must be non-zero in this case.
    if (VALIDATE_XR_FLAGS_ZERO == world_mesh_detector_flags_ml_result) {
        CoreValidLogMessage(instance_info, "VUID-XrWorldMeshBlockML-flags-requiredbitmask",
                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                            objects_info, "XrWorldMeshDetectorFlagsML \"flags\" flag must be non-zero");
        return XR_ERROR_VALIDATION_FAILURE;
    } else if (VALIDATE_XR_FLAGS_SUCCESS != world_mesh_detector_flags_ml_result) {
        // Otherwise, flags must be valid.
        std::ostringstream oss_enum;
        oss_enum << "XrWorldMeshBlockML invalid member XrWorldMeshDetectorFlagsML \"flags\" flag value ";
        oss_enum << Uint32ToHexString(static_cast<uint32_t>(value->flags));
        oss_enum <<" contains illegal bit";
        CoreValidLogMessage(instance_info, "VUID-XrWorldMeshBlockML-flags-parameter",
                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                            objects_info, oss_enum.str());
        return XR_ERROR_VALIDATION_FAILURE;
    }
    // Non-optional array length must be non-zero
    if (0 >= value->indexCount && nullptr != value->indexBuffer) {
        CoreValidLogMessage(instance_info, "VUID-XrWorldMeshBlockML-indexCount-arraylength",
                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                            objects_info,
                            "Structure XrWorldMeshBlockML member indexCount is non-optional and must be greater than 0");
        xr_result = XR_ERROR_VALIDATION_FAILURE;
    }
    // Pointer/array variable with a length variable.  Make sure that
    // if length variable is non-zero that the pointer is not NULL
    if (nullptr == value->indexBuffer && 0 != value->indexCount) {
        CoreValidLogMessage(instance_info, "VUID-XrWorldMeshBlockML-indexBuffer-parameter",
                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name, objects_info,
                            "XrWorldMeshBlockML contains invalid NULL for uint16_t \"indexBuffer\" is which not "
                            "optional since \"indexCount\" is set and must be non-NULL");
        return XR_ERROR_VALIDATION_FAILURE;
    }
    // NOTE: Can't validate "VUID-XrWorldMeshBlockML-indexBuffer-parameter" type
    // Non-optional array length must be non-zero
    if (0 >= value->vertexCount && nullptr != value->vertexBuffer) {
        CoreValidLogMessage(instance_info, "VUID-XrWorldMeshBlockML-vertexCount-arraylength",
                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                            objects_info,
                            "Structure XrWorldMeshBlockML member vertexCount is non-optional and must be greater than 0");
        xr_result = XR_ERROR_VALIDATION_FAILURE;
    }
    // Pointer/array variable with a length variable.  Make sure that
    // if length variable is non-zero that the pointer is not NULL
    if (nullptr == value->vertexBuffer && 0 != value->vertexCount) {
        CoreValidLogMessage(instance_info, "VUID-XrWorldMeshBlockML-vertexBuffer-parameter",
                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name, objects_info,
                            "XrWorldMeshBlockML contains invalid NULL for XrVector3f \"vertexBuffer\" is which not "
                            "optional since \"vertexCount\" is set and must be non-NULL");
        return XR_ERROR_VALIDATION_FAILURE;
    }
    // NOTE: Can't validate "VUID-XrWorldMeshBlockML-vertexBuffer-parameter" type
    // Non-optional array length must be non-zero
    if (0 >= value->normalCount && nullptr != value->normalBuffer) {
        CoreValidLogMessage(instance_info, "VUID-XrWorldMeshBlockML-normalCount-arraylength",
                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                            objects_info,
                            "Structure XrWorldMeshBlockML member normalCount is non-optional and must be greater than 0");
        xr_result = XR_ERROR_VALIDATION_FAILURE;
    }
    // Pointer/array variable with a length variable.  Make sure that
    // if length variable is non-zero that the pointer is not NULL
    if (nullptr == value->normalBuffer && 0 != value->normalCount) {
        CoreValidLogMessage(instance_info, "VUID-XrWorldMeshBlockML-normalBuffer-parameter",
                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name, objects_info,
                            "XrWorldMeshBlockML contains invalid NULL for XrVector3f \"normalBuffer\" is which not "
                            "optional since \"normalCount\" is set and must be non-NULL");
        return XR_ERROR_VALIDATION_FAILURE;
    }
    // NOTE: Can't validate "VUID-XrWorldMeshBlockML-normalBuffer-parameter" type
    // Non-optional array length must be non-zero
    if (0 >= value->confidenceCount && nullptr != value->confidenceBuffer) {
        CoreValidLogMessage(instance_info, "VUID-XrWorldMeshBlockML-confidenceCount-arraylength",
                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                            objects_info,
                            "Structure XrWorldMeshBlockML member confidenceCount is non-optional and must be greater than 0");
        xr_result = XR_ERROR_VALIDATION_FAILURE;
    }
    // Pointer/array variable with a length variable.  Make sure that
    // if length variable is non-zero that the pointer is not NULL
    if (nullptr == value->confidenceBuffer && 0 != value->confidenceCount) {
        CoreValidLogMessage(instance_info, "VUID-XrWorldMeshBlockML-confidenceBuffer-parameter",
                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name, objects_info,
                            "XrWorldMeshBlockML contains invalid NULL for float \"confidenceBuffer\" is which not "
                            "optional since \"confidenceCount\" is set and must be non-NULL");
        return XR_ERROR_VALIDATION_FAILURE;
    }
    // NOTE: Can't validate "VUID-XrWorldMeshBlockML-confidenceBuffer-parameter" type
    // Everything checked out properly
    return xr_result;
}